

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_test.cc
# Opt level: O0

void __thiscall
fizplex::NumericTest_LowerOrEqual_Test::TestBody(NumericTest_LowerOrEqual_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  bool *in_stack_fffffffffffffed8;
  AssertionResult *in_stack_fffffffffffffee0;
  AssertionResult *this_00;
  string local_f0;
  AssertHelper local_d0;
  Message local_c8;
  undefined1 local_b9;
  AssertionResult local_b8;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_71;
  AssertionResult local_70;
  string local_60;
  AssertHelper local_40;
  Message local_38 [3];
  undefined1 local_19;
  AssertionResult local_18;
  
  local_19 = is_le(-1.0,0.0);
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(type *)0x1da474);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_18,(AssertionResult *)"is_le(-1.0, 0.0)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/numeric_test.cc"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    testing::Message::~Message((Message *)0x1da555);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1da5cd);
  local_71 = is_le(0.0,0.0);
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(type *)0x1da5fd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_70,(AssertionResult *)"is_le(0.0, 0.0)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/numeric_test.cc"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message((Message *)0x1da6f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1da768);
  local_b9 = is_le(-30.0,-9.0);
  this_00 = &local_b8;
  testing::AssertionResult::AssertionResult<bool>
            (this_00,in_stack_fffffffffffffed8,(type *)0x1da799);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)&local_b8,(AssertionResult *)"is_le(-30.0, -9)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/numeric_test.cc"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::Message::~Message((Message *)0x1da86e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1da8da);
  return;
}

Assistant:

TEST(NumericTest, LowerOrEqual) {
  EXPECT_TRUE(is_le(-1.0, 0.0));
  EXPECT_TRUE(is_le(0.0, 0.0));
  EXPECT_TRUE(is_le(-30.0, -9));
}